

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O2

unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true> __thiscall
duckdb::GlobMultiFileList::ComplexFilterPushdown
          (GlobMultiFileList *this,ClientContext *context_p,MultiFileOptions *options,
          MultiFilePushdownInfo *info,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *filters)

{
  pthread_mutex_t *__mutex;
  bool bVar1;
  _func_int **in_RAX;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_R9;
  _func_int **local_38;
  
  __mutex = (pthread_mutex_t *)((long)&(context_p->config).home_directory.field_2 + 8);
  local_38 = in_RAX;
  ::std::mutex::lock((mutex *)&__mutex->__data);
  do {
    bVar1 = ExpandNextPath((GlobMultiFileList *)context_p);
  } while (bVar1);
  if ((*(char *)((long)&info->table_index + 1) != '\0') || ((char)info->table_index != '\0')) {
    bVar1 = PushdownInternal((ClientContext *)
                             (context_p->registered_state).
                             super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                             ._M_t.
                             super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                             .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>.
                             _M_head_impl,(MultiFileOptions *)info,(MultiFilePushdownInfo *)filters,
                             in_R9,(vector<duckdb::OpenFileInfo,_true> *)&context_p->config);
    if (bVar1) {
      make_uniq<duckdb::SimpleMultiFileList,duckdb::vector<duckdb::OpenFileInfo,true>&>
                ((duckdb *)&local_38,(vector<duckdb::OpenFileInfo,_true> *)&context_p->config);
      (this->super_MultiFileList)._vptr_MultiFileList = local_38;
      goto LAB_01636fdf;
    }
  }
  (this->super_MultiFileList)._vptr_MultiFileList = (_func_int **)0x0;
LAB_01636fdf:
  pthread_mutex_unlock(__mutex);
  return (unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>)
         (unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>_>)this;
}

Assistant:

unique_ptr<MultiFileList> GlobMultiFileList::ComplexFilterPushdown(ClientContext &context_p,
                                                                   const MultiFileOptions &options,
                                                                   MultiFilePushdownInfo &info,
                                                                   vector<unique_ptr<Expression>> &filters) {
	lock_guard<mutex> lck(lock);

	// Expand all
	// FIXME: lazy expansion
	// FIXME: push down filters into glob
	while (ExpandNextPath()) {
	}

	if (!options.hive_partitioning && !options.filename) {
		return nullptr;
	}
	auto res = PushdownInternal(context, options, info, filters, expanded_files);
	if (res) {
		return make_uniq<SimpleMultiFileList>(expanded_files);
	}

	return nullptr;
}